

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O3

bool __thiscall
cmFindProgramCommand::InitialPass
          (cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  bool bVar1;
  int iVar2;
  string result;
  string local_38;
  
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x75461c);
  iVar2 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,argsIn);
  if (SUB41(iVar2,0) != false) {
    bVar1 = cmFindCommon::ComputeIfDebugModeWanted
                      (&(this->super_cmFindBase).super_cmFindCommon,
                       &(this->super_cmFindBase).VariableName);
    (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar1;
    if ((this->super_cmFindBase).AlreadyDefined == true) {
      cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
    }
    else {
      FindProgram_abi_cxx11_(&local_38,this);
      cmFindBase::StoreFindResult(&this->super_cmFindBase,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool cmFindProgramCommand::InitialPass(std::vector<std::string> const& argsIn)
{

  this->CMakePathName = "PROGRAM";

  // call cmFindBase::ParseArguments
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  std::string const result = this->FindProgram();
  this->StoreFindResult(result);
  return true;
}